

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void parse_block(Parser *psr)

{
  Lexer *lxr;
  uint uVar1;
  uint64_t uVar2;
  Function *pFVar3;
  BcIns *pBVar4;
  FnScope *pFVar5;
  SavedLexer saved;
  bool bVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  Tk binop;
  NodeType head_idx;
  Node NVar11;
  Node result;
  uint8_t local_7c;
  Node local_78;
  int local_68;
  int local_64;
  undefined1 local_60 [12];
  NodeType NStack_54;
  int local_50;
  int iStack_4c;
  anon_union_8_2_0c43866c_for_TkInfo_4 aStack_48;
  Node local_40;
  
  local_64 = psr->locals_count;
  local_68 = psr->scope->next_slot;
  lxr = &psr->lxr;
  bVar6 = true;
  do {
    iVar9 = (psr->lxr).tk.type;
    bVar7 = false;
    switch(iVar9) {
    case 0x10c:
      lex_next(lxr);
      lex_expect(lxr,0x114);
      uVar2 = (psr->lxr).tk.field_4.ident_hash;
      iVar9 = psr->scope->first_local;
      lVar10 = (long)iVar9;
      if (iVar9 < psr->locals_count) {
        do {
          if (psr->locals[lVar10].name == uVar2) {
            psr_trigger_err(psr,"variable already defined");
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                          ,0x573,"void parse_let(Parser *)");
          }
          lVar10 = lVar10 + 1;
        } while (psr->locals_count != lVar10);
      }
      lex_next(lxr);
      lex_expect(lxr,0x3d);
      lex_next(lxr);
      NVar11 = parse_subexpr(psr,PREC_NONE);
      register0x00000010 = NVar11.field_1;
      local_60._0_4_ = NVar11.type;
      expr_to_next_slot(psr,(Node *)local_60);
      psr_new_local(psr,uVar2);
      bVar7 = bVar6;
      break;
    case 0x10d:
      local_78.type = ~NODE_NUM;
      do {
        lex_next(lxr);
        NVar11 = parse_subexpr(psr,PREC_NONE);
        register0x00000010 = NVar11.field_1;
        local_60._0_4_ = NVar11.type;
        expr_to_jmp(psr,(Node *)local_60);
        jmp_ensure_true_falls_through(psr,(Node *)local_60);
        jmp_list_patch(psr,local_60._8_4_,psr->vm->fns[psr->scope->fn].ins_count);
        lex_expect(lxr,0x7b);
        lex_next(lxr);
        parse_block(psr);
        lex_expect(lxr,0x7d);
        lex_next(lxr);
        if (((psr->lxr).tk.type & 0xfffffffeU) == 0x10e) {
          iVar9 = fn_emit(psr->vm->fns + psr->scope->fn,0x1d);
          jmp_list_append(psr,(int *)&local_78,iVar9);
        }
        jmp_list_patch(psr,NStack_54,psr->vm->fns[psr->scope->fn].ins_count);
        iVar9 = (psr->lxr).tk.type;
      } while (iVar9 == 0x10f);
      if (iVar9 == 0x10e) {
        lex_next(lxr);
        lex_expect(lxr,0x7b);
        lex_next(lxr);
        parse_block(psr);
        lex_expect(lxr,0x7d);
        lex_next(lxr);
      }
      iVar9 = psr->vm->fns[psr->scope->fn].ins_count;
      head_idx = local_78.type;
      goto LAB_00103550;
    case 0x10e:
    case 0x10f:
    case 0x112:
      break;
    case 0x110:
      lex_next(lxr);
      iVar9 = psr->vm->fns[psr->scope->fn].ins_count;
      lex_expect(lxr,0x7b);
      lex_next(lxr);
      parse_block(psr);
      lex_expect(lxr,0x7d);
      lex_next(lxr);
      iVar8 = fn_emit(psr->vm->fns + psr->scope->fn,0x1e);
      pBVar4 = psr->vm->fns[psr->scope->fn].ins;
      pBVar4[iVar8] = (uint)(byte)pBVar4[iVar8] + (iVar9 - iVar8) * 0x100 + 0x7fffff00;
      bVar7 = bVar6;
      break;
    case 0x111:
      lex_next(lxr);
      iVar9 = psr->vm->fns[psr->scope->fn].ins_count;
      NVar11 = parse_subexpr(psr,PREC_NONE);
      register0x00000010 = NVar11.field_1;
      local_60._0_4_ = NVar11.type;
      expr_to_jmp(psr,(Node *)local_60);
      jmp_ensure_true_falls_through(psr,(Node *)local_60);
      jmp_list_patch(psr,local_60._8_4_,psr->vm->fns[psr->scope->fn].ins_count);
      lex_expect(lxr,0x7b);
      lex_next(lxr);
      parse_block(psr);
      lex_expect(lxr,0x7d);
      lex_next(lxr);
      iVar8 = fn_emit(psr->vm->fns + psr->scope->fn,0x1e);
      pFVar5 = psr->scope;
      pFVar3 = psr->vm->fns;
      pBVar4 = pFVar3[pFVar5->fn].ins;
      pBVar4[iVar8] = (uint)(byte)pBVar4[iVar8] + (iVar9 - iVar8) * 0x100 + 0x7fffff00;
      iVar9 = pFVar3[pFVar5->fn].ins_count;
      head_idx = NStack_54;
LAB_00103550:
      jmp_list_patch(psr,head_idx,iVar9);
      bVar7 = bVar6;
      break;
    case 0x113:
      lex_next(lxr);
      lex_expect(lxr,0x114);
      uVar2 = (psr->lxr).tk.field_4.ident_hash;
      lex_next(lxr);
      iVar9 = parse_fn_args_body(psr);
      psr_new_local(psr,uVar2);
      pFVar5 = psr->scope;
      uVar1 = pFVar5->next_slot;
      pFVar5->next_slot = uVar1 + 1;
      fn_emit(psr->vm->fns + pFVar5->fn,(uVar1 & 0xff) * 0x100 + iVar9 * 0x10000 + 3);
      bVar7 = bVar6;
      break;
    case 0x114:
      lex_save((SavedLexer *)local_60,lxr);
      lex_next(lxr);
      iVar9 = (psr->lxr).tk.type;
      saved.line = local_60._4_4_;
      saved.cursor = local_60._0_4_;
      saved.tk._0_8_ = stack0xffffffffffffffa8;
      saved.tk.length = local_50;
      saved.tk.line = iStack_4c;
      saved.tk.field_4.num = aStack_48.num;
      lex_restore(lxr,saved);
      if ((4 < iVar9 - 0x101U) && (iVar9 != 0x3d)) {
        parse_subexpr(psr,PREC_NONE);
        bVar7 = bVar6;
        break;
      }
      uVar2 = (psr->lxr).tk.field_4.ident_hash;
      lex_next(lxr);
      iVar9 = psr->scope->first_local;
      iVar8 = -1;
      if (iVar9 < psr->locals_count) {
        lVar10 = 0;
        do {
          if (psr->locals[iVar9 + lVar10].name == uVar2) {
            iVar8 = (int)lVar10;
            break;
          }
          lVar10 = lVar10 + 1;
        } while ((long)psr->locals_count - (long)iVar9 != lVar10);
      }
      if (iVar8 == -1) {
        psr_trigger_err(psr,"variable not defined");
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/parser.c"
                      ,0x533,"void parse_assign(Parser *)");
      }
      binop = 0;
      switch((psr->lxr).tk.type) {
      case 0x101:
        binop = 0x2b;
        break;
      case 0x102:
        binop = 0x2d;
        break;
      case 0x103:
        binop = 0x2a;
        break;
      case 0x104:
        binop = 0x2f;
        break;
      default:
        bVar7 = true;
        goto LAB_0010364a;
      }
      bVar7 = false;
LAB_0010364a:
      lex_next(lxr);
      NVar11 = parse_subexpr(psr,PREC_NONE);
      local_78.field_1 = NVar11.field_1;
      local_78.type = NVar11.type;
      local_7c = (uint8_t)iVar8;
      if (bVar7) {
        expr_to_slot(psr,local_7c,&local_78);
        bVar7 = bVar6;
      }
      else {
        local_40.type = NODE_NON_RELOC;
        NVar11._4_4_ = 0;
        NVar11.type = local_78.type;
        NVar11.field_1 = local_78.field_1;
        local_40.field_1.slot = local_7c;
        expr_emit_arith(psr,binop,&local_40,NVar11);
        expr_to_slot(psr,local_7c,&local_40);
        bVar7 = bVar6;
      }
      break;
    default:
      if (iVar9 == 0x28) {
        parse_subexpr(psr,PREC_NONE);
        bVar7 = bVar6;
      }
    }
    bVar6 = bVar7;
    if (!bVar7) {
      psr->locals_count = local_64;
      psr->scope->next_slot = local_68;
      return;
    }
  } while( true );
}

Assistant:

static void parse_block(Parser *psr) {
	// Save the initial number of locals and the next slot, so we can discard
	// the locals created in this block once we reach the end of it
	int locals_count = psr->locals_count;
	int next_slot = psr->scope->next_slot;

	// Continually parse statements
	bool have_statement = true;
	while (have_statement) {
		switch (psr->lxr.tk.type) {
			case TK_LET:   parse_let(psr); break;
			case TK_IDENT: parse_assign_or_expr(psr); break;
			case '(':      parse_expr(psr); break;
			case TK_IF:    parse_if(psr); break;
			case TK_LOOP:  parse_loop(psr); break;
			case TK_WHILE: parse_while(psr); break;
			case TK_FN:    parse_fn(psr); break;

			// Couldn't find a statement to parse
		default:
			have_statement = false;
			break;
		}
	}

	// Discard all locals created in this block
	psr->locals_count = locals_count;
	psr->scope->next_slot = next_slot;
}